

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O1

ulint __thiscall bwtil::PartialSums::getCount(PartialSums *this,symbol s)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  ulong uVar4;
  long lVar5;
  sbyte sVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  undefined7 in_register_00000031;
  ulong uVar10;
  ulint MASK;
  
  if ((int)CONCAT71(in_register_00000031,s) != 0) {
    bVar1 = this->d;
    uVar8 = (uint)(byte)(s - 1) / (uint)bVar1 + ((uint)this->nr_of_nodes - (uint)this->nr_of_leafs);
    puVar3 = (this->nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    bVar2 = this->log2n;
    sVar6 = (bVar2 < 0x41) * ('@' - bVar2);
    uVar10 = ((puVar3[uVar8] >>
              ((ulong)((~((uint)(byte)(s - 1) % (uint)bVar1) + (uint)bVar1) * (uint)bVar2) & 0x3f))
             << sVar6) >> sVar6;
    if (uVar8 != 0) {
      uVar8 = uVar8 & 0xffff;
      do {
        lVar5 = (long)(int)(uVar8 - 1) % (long)(int)(bVar1 + 1);
        uVar9 = (uint)lVar5;
        uVar4 = (long)(int)(~uVar9 + uVar8) / (long)(int)(bVar1 + 1);
        uVar7 = (ushort)uVar4;
        if ((char)lVar5 != '\0') {
          uVar10 = uVar10 + (puVar3[uVar4 & 0xffff] >>
                             ((ulong)((bVar1 - uVar9) * (uint)bVar2) & 0x3f) &
                            ~(-1L << ((ulong)bVar2 & 0x3f)));
        }
        uVar8 = (uint)uVar7;
      } while (uVar7 != 0);
    }
    return this->base_counter + uVar10;
  }
  return (ulong)this->base_counter;
}

Assistant:

ulint getCount(symbol s){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): getCount() called on empty counter\n";
			exit(0);
		}
	#endif

		if(s==0)
			return base_counter;

		s--;

	#ifdef DEBUG
		if(s>=sigma){
			cout << "ERROR (PartialSums): symbol " << s << " not in alphabet.\n";
			exit(0);
		}
	#endif

		uint current_node = (nr_of_nodes - nr_of_leafs) + (s/d);//offset leafs + leaf number

		uint offset_in_node = s%d;//number of the counter inside the node

		ulint count = getCounterNumber(nodes[current_node],offset_in_node);

		while(current_node>0){//repeat while current node is not the root

			offset_in_node = childNumber(current_node);
			current_node = parent(current_node);

			if(offset_in_node>0)
				count += getCounterNumber(nodes[current_node],offset_in_node-1);

		}

		return count + base_counter;

	}